

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::AvgState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintAverageOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               AvgState<duckdb::hugeint_t> **states,ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  AvgState<duckdb::hugeint_t> *pAVar2;
  hugeint_t lhs;
  hugeint_t lhs_00;
  hugeint_t rhs;
  hugeint_t rhs_00;
  hugeint_t rhs_01;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  ulong uVar7;
  unsigned_long uVar8;
  hugeint_t hVar9;
  int64_t *piVar10;
  int64_t in_stack_ffffffffffffffa0;
  AvgState<duckdb::hugeint_t> **ppAVar11;
  uint64_t in_stack_ffffffffffffffa8;
  ulong uVar12;
  int64_t in_stack_ffffffffffffffb0;
  ulong uVar13;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar10 = &idata->upper;
      iVar6 = 0;
      do {
        pAVar2 = states[iVar6];
        pAVar2->count = pAVar2->count + 1;
        hVar9.upper = in_stack_ffffffffffffffa0;
        hVar9.lower = (uint64_t)piVar10;
        rhs_01.upper = in_stack_ffffffffffffffb0;
        rhs_01.lower = in_stack_ffffffffffffffa8;
        hVar9 = Hugeint::Add<true>(hVar9,rhs_01);
        pAVar2->value = hVar9;
        iVar6 = iVar6 + 1;
        piVar10 = piVar10 + 2;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar12 = count + 0x3f >> 6;
    piVar10 = &idata->upper;
    uVar3 = 0;
    uVar4 = 0;
    uVar13 = count;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        uVar8 = puVar1[uVar3];
      }
      uVar7 = uVar4 + 0x40;
      if (count <= uVar4 + 0x40) {
        uVar7 = count;
      }
      uVar5 = uVar7;
      ppAVar11 = states;
      if (uVar8 != 0) {
        uVar5 = uVar4;
        if (uVar8 == 0xffffffffffffffff) {
          if (uVar4 < uVar7) {
            do {
              pAVar2 = states[uVar4];
              pAVar2->count = pAVar2->count + 1;
              lhs.upper = (int64_t)ppAVar11;
              lhs.lower = (uint64_t)piVar10;
              rhs.upper = uVar13;
              rhs.lower = uVar12;
              hVar9 = Hugeint::Add<true>(lhs,rhs);
              pAVar2->value = hVar9;
              uVar5 = uVar4 + 1;
              uVar4 = uVar5;
            } while (uVar7 != uVar5);
          }
        }
        else if (uVar4 < uVar7) {
          uVar5 = 0;
          count = uVar13;
          do {
            if ((uVar8 >> (uVar5 & 0x3f) & 1) != 0) {
              pAVar2 = states[uVar4 + uVar5];
              pAVar2->count = pAVar2->count + 1;
              lhs_00.upper = (int64_t)ppAVar11;
              lhs_00.lower = (uint64_t)piVar10;
              rhs_00.upper = count;
              rhs_00.lower = uVar12;
              hVar9 = Hugeint::Add<true>(lhs_00,rhs_00);
              pAVar2->value = hVar9;
            }
            uVar5 = uVar5 + 1;
          } while ((uVar4 - uVar7) + uVar5 != 0);
          uVar5 = uVar4 + uVar5;
          uVar13 = count;
        }
      }
      uVar3 = uVar3 + 1;
      uVar4 = uVar5;
      states = ppAVar11;
    } while (uVar3 != uVar12);
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}